

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void get_true_pan(DUMB_IT_SIGDATA *sigdata,IT_CHANNEL *channel)

{
  int iVar1;
  int local_28;
  unsigned_short local_24;
  int local_20;
  int truepan;
  IT_INSTRUMENT *instrument;
  IT_CHANNEL *channel_local;
  DUMB_IT_SIGDATA *sigdata_local;
  
  channel->truepan = (ushort)channel->pan << 8;
  if (((channel->sample != 0) && (channel->truepan < 0x4001)) && ((sigdata->flags & 4U) != 0)) {
    iVar1 = channel->instrument - 1;
    local_28 = ((uint)channel->note - (uint)sigdata->instrument[iVar1].pp_centre) *
               (int)sigdata->instrument[iVar1].pp_separation * 0x20 + (uint)channel->truepan;
    local_20 = local_28;
    if (0x3fff < local_28) {
      local_20 = 0x4000;
    }
    if (local_20 < 0) {
      local_24 = 0;
    }
    else {
      if (0x3fff < local_28) {
        local_28 = 0x4000;
      }
      local_24 = (unsigned_short)local_28;
    }
    channel->truepan = local_24;
  }
  return;
}

Assistant:

static void get_true_pan(DUMB_IT_SIGDATA *sigdata, IT_CHANNEL *channel)
{
	channel->truepan = channel->pan << IT_ENVELOPE_SHIFT;

	if (channel->sample && !IT_IS_SURROUND_SHIFTED(channel->truepan) && (sigdata->flags & IT_USE_INSTRUMENTS)) {
		IT_INSTRUMENT *instrument = &sigdata->instrument[channel->instrument-1];
		int truepan = channel->truepan;
		truepan += (channel->note - instrument->pp_centre) * instrument->pp_separation << (IT_ENVELOPE_SHIFT - 3);
		channel->truepan = (unsigned short)MID(0, truepan, 64 << IT_ENVELOPE_SHIFT);
	}
}